

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O2

gc_heap_ptr<mjs::regexp_object> __thiscall
mjs::anon_unknown_35::check_type
          (anon_unknown_35 *this,gc_heap_ptr<mjs::global_object> *global,value *v)

{
  gc_heap_ptr_untyped *this_00;
  native_error_exception *this_01;
  global_object *this_02;
  gc_heap_ptr<mjs::regexp_object> *r;
  gc_heap_ptr<mjs::regexp_object> gVar1;
  object local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  size_t local_1c0;
  wstring_view local_1a8;
  wostringstream woss;
  
  gVar1 = cast_to_regexp(this,v);
  if (*(long *)this != 0) {
    gVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (gc_heap_ptr<mjs::regexp_object>)gVar1.super_gc_heap_ptr_untyped;
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
  if (v->type_ == object) {
    this_00 = &value::object_value(v)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::get(this_00);
    object::class_name(&local_1f8);
    mjs::operator<<((wostream *)&woss,(string *)&local_1f8);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1f8);
  }
  else {
    debug_print((wostream *)&woss,v,4,0x7fffffff,0);
  }
  std::operator<<((wostream *)&woss," is not a RegExp");
  this_01 = (native_error_exception *)__cxa_allocate_exception(0x58);
  this_02 = (global_object *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  global_object::stack_trace_abi_cxx11_((wstring *)&local_1f8,this_02);
  local_1d8._M_len = (size_t)local_1f8.heap_;
  local_1d8._M_str = (wchar_t *)local_1f8._vptr_object;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_01,type,&local_1d8,&local_1a8);
  __cxa_throw(this_01,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

gc_heap_ptr<regexp_object> check_type(const gc_heap_ptr<global_object>& global, const value& v) {
    if (auto r = cast_to_regexp(v)) {
        return r;
    }
    std::wostringstream woss;
    if (v.type() == value_type::object) {
        woss << v.object_value()->class_name();
    } else {
        debug_print(woss, v, 4);
    }
    woss << " is not a RegExp";
    throw native_error_exception{native_error_type::type, global->stack_trace(), woss.str()};
}